

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP5Writer::TwoLevelAggregationMetadata(BP5Writer *this,TimestepInfo *TSInfo)

{
  BP5Serializer *this_00;
  Comm *pCVar1;
  element_type *peVar2;
  int iVar3;
  int iVar4;
  unsigned_long *n;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer puVar5;
  uint64_t uVar6;
  JSONProfiler *this_01;
  size_type sVar7;
  unsigned_long source;
  initializer_list<adios2::core::iovec> __l;
  initializer_list<adios2::core::iovec> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  allocator_type local_32c;
  allocator_type local_32b;
  allocator_type local_32a;
  allocator_type local_329;
  vector<unsigned_long,_std::allocator<unsigned_long>_> DataSizes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> RecvCounts;
  vector<char,_std::allocator<char>_> RecvBuffer;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  UniqueMetaMetaBlocks;
  vector<char,_std::allocator<char>_> MetaBuffer;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> AttributeBlocks;
  vector<unsigned_long,_std::allocator<unsigned_long>_> WriterDataPositions;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *local_248;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> Metadata;
  size_t LocalSize;
  string meta1_gather_str;
  _Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  local_1e8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1d0;
  _Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  local_1b8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1a0;
  _Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  local_188;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"ES_meta1",(allocator *)&meta1_gather_str);
  this_01 = &this->m_Profiler;
  profiling::JSONProfiler::Start(this_01,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar3 = (*((TSInfo->MetaEncodeBuffer).
             super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Buffer[2])();
  peVar2 = (TSInfo->AttributeEncodeBuffer).
           super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar5 = (pointer)((TSInfo->MetaEncodeBuffer).
                     super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->m_FixedSize;
  if (peVar2 == (element_type *)0x0) {
    AttributeBlocks.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    AttributeBlocks.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    iVar4 = (*peVar2->_vptr_Buffer[2])();
    AttributeBlocks.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar4);
    AttributeBlocks.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)((TSInfo->AttributeEncodeBuffer).
                   super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  m_FixedSize;
  }
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
            *)&local_188,&TSInfo->NewMetaMetaBlocks);
  __l._M_len = 1;
  __l._M_array = (iterator)&WriterDataPositions;
  WriterDataPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar3);
  WriterDataPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar5;
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::vector
            ((vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)&RecvCounts,__l,
             &local_32c);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&AttributeBlocks;
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::vector
            ((vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)&RecvBuffer,__l_00
             ,&local_329);
  Metadata.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this->m_ThisTimestepDataSize;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&Metadata;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&UniqueMetaMetaBlocks,__l_01,
             &local_32a);
  LocalSize = this->m_StartDataPos;
  __l_02._M_len = 1;
  __l_02._M_array = &LocalSize;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&DataSizes,__l_02,&local_32b);
  this_00 = &this->m_BP5Serializer;
  adios2::format::BP5Serializer::CopyMetadataToContiguous
            ((vector<char,_std::allocator<char>_> *)&meta1_gather_str,this_00,
             (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
              *)&local_188,
             (vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)&RecvCounts,
             (vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)&RecvBuffer,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&UniqueMetaMetaBlocks,
             &DataSizes);
  local_248 = (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
               *)&MetaBuffer;
  std::vector<char,_std::allocator<char>_>::_M_move_assign
            ((vector<char,_std::allocator<char>_> *)local_248,&meta1_gather_str);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&meta1_gather_str);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&UniqueMetaMetaBlocks);
  std::_Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~_Vector_base
            ((_Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)&RecvBuffer)
  ;
  std::_Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~_Vector_base
            ((_Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)&RecvCounts)
  ;
  std::
  _Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::~_Vector_base(&local_188);
  pCVar1 = &(this->m_AggregatorMetadata).super_MPIAggregator.m_Comm;
  iVar3 = helper::Comm::Size(pCVar1);
  std::__cxx11::to_string((string *)&RecvCounts,iVar3);
  std::operator+(&meta1_gather_str,"ES_meta1_gather_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&RecvCounts);
  std::__cxx11::string::~string((string *)&RecvCounts);
  profiling::JSONProfiler::AddTimerWatch(this_01,&meta1_gather_str,true);
  iVar3 = helper::Comm::Size(pCVar1);
  if (1 < iVar3) {
    std::__cxx11::string::string((string *)&local_70,(string *)&meta1_gather_str);
    profiling::JSONProfiler::Start(this_01,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    source = (long)MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    helper::Comm::GatherValues<unsigned_long>(&RecvCounts,pCVar1,source,0);
    RecvBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    RecvBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    RecvBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar3 = helper::Comm::Rank(pCVar1);
    if (iVar3 == 0) {
      sVar7 = 0;
      for (puVar5 = RecvCounts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar5 != RecvCounts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
        sVar7 = sVar7 + *puVar5;
      }
      std::vector<char,_std::allocator<char>_>::resize(&RecvBuffer,sVar7);
    }
    helper::Comm::GathervArrays<char>
              (pCVar1,MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,source,
               RecvCounts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)RecvCounts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)RecvCounts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,
               RecvBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,0);
    std::__cxx11::string::string((string *)&local_90,(string *)&meta1_gather_str);
    profiling::JSONProfiler::Stop(this_01,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    iVar3 = helper::Comm::Rank(pCVar1);
    if (iVar3 == 0) {
      UniqueMetaMetaBlocks.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      UniqueMetaMetaBlocks.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      UniqueMetaMetaBlocks.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      WriterDataPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      WriterDataPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      WriterDataPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AttributeBlocks.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      AttributeBlocks.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      AttributeBlocks.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a0,&RecvCounts);
      adios2::format::BP5Serializer::BreakoutContiguousMetadata
                (&Metadata,this_00,&RecvBuffer,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a0,
                 &UniqueMetaMetaBlocks,&AttributeBlocks,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
                 &WriterDataPositions);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1a0);
      if (MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_finish !=
          MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start) {
        MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                *)&local_1b8,&UniqueMetaMetaBlocks);
      adios2::format::BP5Serializer::CopyMetadataToContiguous
                ((vector<char,_std::allocator<char>_> *)&LocalSize,this_00,
                 (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                  *)&local_1b8,&Metadata,&AttributeBlocks,&DataSizes,&WriterDataPositions);
      std::vector<char,_std::allocator<char>_>::_M_move_assign
                (&MetaBuffer,(_Vector_base<char,_std::allocator<char>_> *)&LocalSize);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&LocalSize);
      std::
      _Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::~_Vector_base(&local_1b8);
      std::_Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~_Vector_base
                (&Metadata.
                  super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>);
      std::_Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~_Vector_base
                (&AttributeBlocks.
                  super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&WriterDataPositions.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      _Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::~_Vector_base(&UniqueMetaMetaBlocks.
                       super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                     );
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&RecvBuffer.super__Vector_base<char,_std::allocator<char>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&RecvCounts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  std::__cxx11::string::string((string *)&local_b0,"ES_meta1",(allocator *)&RecvCounts);
  profiling::JSONProfiler::Stop(this_01,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,"ES_meta2",(allocator *)&RecvCounts);
  profiling::JSONProfiler::Start(this_01,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  iVar3 = helper::Comm::Rank(pCVar1);
  if (iVar3 == 0) {
    UniqueMetaMetaBlocks.
    super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    UniqueMetaMetaBlocks.
    super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    UniqueMetaMetaBlocks.
    super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LocalSize = (long)MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
    pCVar1 = &this->m_CommMetadataAggregators;
    iVar3 = helper::Comm::Size(pCVar1);
    std::__cxx11::to_string((string *)&RecvBuffer,iVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&RecvCounts,
                   "ES_meta2_gather_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&RecvBuffer)
    ;
    std::__cxx11::string::~string((string *)&RecvBuffer);
    profiling::JSONProfiler::AddTimerWatch(this_01,(string *)&RecvCounts,true);
    iVar3 = helper::Comm::Size(pCVar1);
    if (iVar3 < 2) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&DataSizes,&LocalSize);
    }
    else {
      std::__cxx11::string::string((string *)&local_f0,(string *)&RecvCounts);
      profiling::JSONProfiler::Start(this_01,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      helper::Comm::GatherValues<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&RecvBuffer,pCVar1,
                 LocalSize,0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(&DataSizes);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&RecvBuffer);
      iVar3 = helper::Comm::Rank(pCVar1);
      if (iVar3 == 0) {
        sVar7 = 0;
        for (puVar5 = DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar5 != DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
          sVar7 = sVar7 + *puVar5;
        }
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&UniqueMetaMetaBlocks,sVar7);
      }
      helper::Comm::GathervArrays<char>
                (pCVar1,MetaBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,LocalSize,
                 DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 (long)DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,
                 (char *)UniqueMetaMetaBlocks.
                         super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                         ._M_impl.super__Vector_impl_data._M_start,0);
      std::__cxx11::string::string((string *)&local_110,(string *)&RecvCounts);
      profiling::JSONProfiler::Stop(this_01,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      local_248 = &UniqueMetaMetaBlocks;
    }
    iVar3 = helper::Comm::Rank(pCVar1);
    if (iVar3 == 0) {
      RecvBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      RecvBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      RecvBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      WriterDataPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      WriterDataPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      WriterDataPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AttributeBlocks.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      AttributeBlocks.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      AttributeBlocks.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->m_WriterDataPos,0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1d0,&DataSizes);
      adios2::format::BP5Serializer::BreakoutContiguousMetadata
                (&Metadata,this_00,(vector<char,_std::allocator<char>_> *)local_248,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1d0,
                 (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                  *)&RecvBuffer,&AttributeBlocks,&WriterDataPositions,&this->m_WriterDataPos);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1d0);
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                *)&local_1e8,
               (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                *)&RecvBuffer);
      WriteMetaMetadata(this,(vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                              *)&local_1e8);
      std::
      _Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::~_Vector_base(&local_1e8);
      this->m_LatestMetaDataPos = this->m_MetaDataPos;
      std::__cxx11::string::string((string *)&local_130,"ES_write_metadata",(allocator *)&local_32c)
      ;
      profiling::JSONProfiler::Start(this_01,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      uVar6 = WriteMetadata(this,&Metadata,&AttributeBlocks);
      this->m_LatestMetaDataSize = uVar6;
      std::__cxx11::string::string((string *)&local_150,"ES_write_metadata",(allocator *)&local_32c)
      ;
      profiling::JSONProfiler::Stop(this_01,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      if ((this->super_BP5Engine).m_Parameters.AsyncWrite == 0) {
        WriteMetadataFileIndex(this,this->m_LatestMetaDataPos,this->m_LatestMetaDataSize);
      }
      std::_Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~_Vector_base
                (&Metadata.
                  super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>);
      std::_Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~_Vector_base
                (&AttributeBlocks.
                  super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&WriterDataPositions.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      _Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::~_Vector_base((_Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                       *)&RecvBuffer);
    }
    std::__cxx11::string::~string((string *)&RecvCounts);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&DataSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&UniqueMetaMetaBlocks);
  }
  std::__cxx11::string::string((string *)&local_170,"ES_meta2",(allocator *)&RecvCounts);
  profiling::JSONProfiler::Stop(this_01,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&meta1_gather_str);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&MetaBuffer.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void BP5Writer::TwoLevelAggregationMetadata(format::BP5Serializer::TimestepInfo TSInfo)
{
    /*
     * Two-step metadata aggregation
     */
    m_Profiler.Start("ES_meta1");
    std::vector<char> MetaBuffer;
    core::iovec m{TSInfo.MetaEncodeBuffer->Data(), TSInfo.MetaEncodeBuffer->m_FixedSize};
    core::iovec a{nullptr, 0};
    if (TSInfo.AttributeEncodeBuffer)
    {
        a = {TSInfo.AttributeEncodeBuffer->Data(), TSInfo.AttributeEncodeBuffer->m_FixedSize};
    }
    MetaBuffer = m_BP5Serializer.CopyMetadataToContiguous(
        TSInfo.NewMetaMetaBlocks, {m}, {a}, {m_ThisTimestepDataSize}, {m_StartDataPos});

    std::string meta1_gather_str =
        "ES_meta1_gather_" + std::to_string(m_AggregatorMetadata.m_Comm.Size());
    m_Profiler.AddTimerWatch(meta1_gather_str, true);

    if (m_AggregatorMetadata.m_Comm.Size() > 1)
    { // level 1
        m_Profiler.Start(meta1_gather_str);
        size_t LocalSize = MetaBuffer.size();
        std::vector<size_t> RecvCounts = m_AggregatorMetadata.m_Comm.GatherValues(LocalSize, 0);
        std::vector<char> RecvBuffer;
        if (m_AggregatorMetadata.m_Comm.Rank() == 0)
        {
            uint64_t TotalSize = 0;
            for (auto &n : RecvCounts)
                TotalSize += n;
            RecvBuffer.resize(TotalSize);
        }
        m_AggregatorMetadata.m_Comm.GathervArrays(MetaBuffer.data(), LocalSize, RecvCounts.data(),
                                                  RecvCounts.size(), RecvBuffer.data(), 0);
        m_Profiler.Stop(meta1_gather_str);
        if (m_AggregatorMetadata.m_Comm.Rank() == 0)
        {
            std::vector<format::BP5Base::MetaMetaInfoBlock> UniqueMetaMetaBlocks;
            std::vector<uint64_t> DataSizes;
            std::vector<uint64_t> WriterDataPositions;
            std::vector<core::iovec> AttributeBlocks;
            auto Metadata = m_BP5Serializer.BreakoutContiguousMetadata(
                RecvBuffer, RecvCounts, UniqueMetaMetaBlocks, AttributeBlocks, DataSizes,
                WriterDataPositions);

            MetaBuffer.clear();
            MetaBuffer = m_BP5Serializer.CopyMetadataToContiguous(
                UniqueMetaMetaBlocks, Metadata, AttributeBlocks, DataSizes, WriterDataPositions);
        }
    } // level 1
    m_Profiler.Stop("ES_meta1");
    m_Profiler.Start("ES_meta2");
    // level 2
    if (m_AggregatorMetadata.m_Comm.Rank() == 0)
    {
        std::vector<char> RecvBuffer;
        std::vector<char> *buf;
        std::vector<size_t> RecvCounts;
        size_t LocalSize = MetaBuffer.size();
        std::string meta2_gather_str =
            "ES_meta2_gather_" + std::to_string(m_CommMetadataAggregators.Size());
        m_Profiler.AddTimerWatch(meta2_gather_str, true);
        if (m_CommMetadataAggregators.Size() > 1)
        {
            m_Profiler.Start(meta2_gather_str);
            RecvCounts = m_CommMetadataAggregators.GatherValues(LocalSize, 0);
            if (m_CommMetadataAggregators.Rank() == 0)
            {
                uint64_t TotalSize = 0;
                for (auto &n : RecvCounts)
                    TotalSize += n;
                RecvBuffer.resize(TotalSize);
                /*std::cout << "MD Lvl-2: rank " << m_Comm.Rank() << " gather "
                          << TotalSize << " bytes from aggregator group"
                          << std::endl;*/
            }

            m_CommMetadataAggregators.GathervArrays(MetaBuffer.data(), LocalSize, RecvCounts.data(),
                                                    RecvCounts.size(), RecvBuffer.data(), 0);
            buf = &RecvBuffer;
            m_Profiler.Stop(meta2_gather_str);
        }
        else
        {
            buf = &MetaBuffer;
            RecvCounts.push_back(LocalSize);
        }

        if (m_CommMetadataAggregators.Rank() == 0)
        {
            std::vector<format::BP5Base::MetaMetaInfoBlock> UniqueMetaMetaBlocks;
            std::vector<uint64_t> DataSizes;
            std::vector<core::iovec> AttributeBlocks;
            m_WriterDataPos.resize(0);
            auto Metadata = m_BP5Serializer.BreakoutContiguousMetadata(
                *buf, RecvCounts, UniqueMetaMetaBlocks, AttributeBlocks, DataSizes,
                m_WriterDataPos);
            assert(m_WriterDataPos.size() == static_cast<size_t>(m_Comm.Size()));
            WriteMetaMetadata(UniqueMetaMetaBlocks);
            m_LatestMetaDataPos = m_MetaDataPos;
            m_Profiler.Start("ES_write_metadata");
            m_LatestMetaDataSize = WriteMetadata(Metadata, AttributeBlocks);
            m_Profiler.Stop("ES_write_metadata");
            if (!m_Parameters.AsyncWrite)
            {
                WriteMetadataFileIndex(m_LatestMetaDataPos, m_LatestMetaDataSize);
            }
        }
    } // level 2
    m_Profiler.Stop("ES_meta2");
}